

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_ironskin(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *in_RDX;
  int in_ESI;
  __type_conflict2 _Var2;
  AFFECT_DATA af;
  void *in_stack_ffffffffffffff78;
  void *in_stack_ffffffffffffff80;
  CHAR_DATA *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  undefined2 in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff96;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  undefined2 in_stack_ffffffffffffff9e;
  undefined2 uVar6;
  CHAR_DATA *in_stack_ffffffffffffffa0;
  
  bVar1 = is_affected(in_RDX,(int)gsn_ironskin);
  if (((!bVar1) && (bVar1 = is_affected(in_RDX,(int)gsn_diamondskin), !bVar1)) &&
     (bVar1 = is_affected(in_RDX,(int)gsn_stoneskin), !bVar1)) {
    act((char *)CONCAT26(in_stack_ffffffffffffff96,
                         CONCAT24(in_stack_ffffffffffffff94,
                                  CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
    act((char *)CONCAT26(in_stack_ffffffffffffff96,
                         CONCAT24(in_stack_ffffffffffffff94,
                                  CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))),
        in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
    init_affect((AFFECT_DATA *)0x6e6d15);
    uVar3 = (undefined2)(in_ESI / 4);
    new_affect_to_char(in_stack_ffffffffffffffa0,
                       (AFFECT_DATA *)
                       CONCAT26(in_stack_ffffffffffffff9e,
                                CONCAT24((short)(in_ESI / 3),CONCAT22(0x11,uVar3))));
    uVar4 = 0;
    uVar5 = 0;
    uVar6 = 0xc;
    _Var2 = std::pow<int,int>(0,0x6e6db9);
    new_affect_to_char((CHAR_DATA *)((long)_Var2 | (ulong)in_stack_ffffffffffffffa0),
                       (AFFECT_DATA *)CONCAT26(uVar6,CONCAT24(uVar5,CONCAT22(uVar4,uVar3))));
    return;
  }
  send_to_char((char *)CONCAT26(in_stack_ffffffffffffff96,
                                CONCAT24(in_stack_ffffffffffffff94,
                                         CONCAT22(in_stack_ffffffffffffff92,
                                                  in_stack_ffffffffffffff90))),
               in_stack_ffffffffffffff88);
  return;
}

Assistant:

void spell_ironskin(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;

	if (is_affected(ch, gsn_ironskin) || is_affected(ch, gsn_diamondskin) || is_affected(ch, gsn_stoneskin))
	{
		send_to_char("Your skin is already magically hardened.\n\r", ch);
		return;
	}

	act("Your skin hardens and takes on a metallic tone.", ch, 0, 0, TO_CHAR);
	act("$n's skin hardens and takes on a metallic tone.", ch, 0, 0, TO_ROOM);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = AFT_SPELL;
	af.type = gsn_ironskin;
	af.owner = ch;
	af.level = level;
	af.location = APPLY_AC;
	af.modifier = level / 3;
	af.duration = level / 4;
	af.end_fun = nullptr;
	new_affect_to_char(ch, &af);

	af.where = TO_VULN;
	af.location = 0;
	af.modifier = 0;
	af.mod_name = MOD_RESISTANCE;
	SET_BIT(af.bitvector, VULN_LIGHTNING);
	new_affect_to_char(ch, &af);
}